

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  cmake *this_00;
  cmState *state;
  bool bVar1;
  __type _Var2;
  Value *pVVar3;
  char *pcVar4;
  GeneratorInfo *pGVar5;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __it;
  pointer __lhs;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var6;
  string *psVar7;
  long lVar8;
  Value *this_01;
  long lVar9;
  string suffix;
  string cachedValueCML;
  allocator local_221;
  GeneratorInfo *local_220;
  string valueCML;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string generator;
  string cachedValue;
  string sourceDirectory;
  string buildDirectory;
  string extraGenerator;
  string platform;
  string toolset;
  string cachePath;
  
  this_01 = &request->Data;
  pVVar3 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&sourceDirectory,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&buildDirectory,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&generator,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&extraGenerator,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&toolset,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&platform,pVVar3);
  if (buildDirectory._M_string_length == 0) {
    std::__cxx11::string::string((string *)&cachedValueCML,"\"",(allocator *)&valueCML);
    std::operator+(&suffix,&cachedValueCML,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&cachedValue,&suffix,"\" is missing.");
    setErrorMessage(errorMessage,&cachedValue);
    goto LAB_0042e0b8;
  }
  this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
            super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  bVar1 = cmsys::SystemTools::PathExists(&buildDirectory);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&buildDirectory);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&cachedValueCML,"\"",(allocator *)&valueCML);
      std::operator+(&suffix,&cachedValueCML,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&cachedValue,&suffix,"\" exists but is not a directory.");
      setErrorMessage(errorMessage,&cachedValue);
      goto LAB_0042e0b8;
    }
    cmake::FindCacheFile(&cachePath,&buildDirectory);
    bVar1 = cmake::LoadCache(this_00,&cachePath);
    if (!bVar1) {
LAB_0042de9c:
      std::__cxx11::string::~string((string *)&cachePath);
      goto LAB_0042dea9;
    }
    state = this_00->State;
    std::__cxx11::string::string
              ((string *)&cachedValue,"CMAKE_GENERATOR",(allocator *)&cachedValueCML);
    std::__cxx11::string::string((string *)&suffix,"generator",(allocator *)&valueCML);
    bVar1 = testValue(state,&cachedValue,&generator,&suffix,errorMessage);
    std::__cxx11::string::~string((string *)&suffix);
    std::__cxx11::string::~string((string *)&cachedValue);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&cachedValue,"CMAKE_EXTRA_GENERATOR",(allocator *)&cachedValueCML);
      std::__cxx11::string::string((string *)&suffix,"extra generator",(allocator *)&valueCML);
      bVar1 = testValue(state,&cachedValue,&extraGenerator,&suffix,errorMessage);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&cachedValue);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&suffix,"CMAKE_HOME_DIRECTORY",(allocator *)&cachedValueCML);
        pcVar4 = cmState::GetCacheEntryValue(state,&suffix);
        std::__cxx11::string::string((string *)&cachedValue,pcVar4,(allocator *)&valueCML);
        std::__cxx11::string::~string((string *)&suffix);
        std::__cxx11::string::string
                  ((string *)&suffix,"/CMakeLists.txt",(allocator *)&cachedValueCML);
        std::operator+(&cachedValueCML,&cachedValue,&suffix);
        std::operator+(&valueCML,&sourceDirectory,&suffix);
        bVar1 = cmsys::SystemTools::SameFile(&valueCML,&cachedValueCML);
        if (bVar1) {
          if (sourceDirectory._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&sourceDirectory);
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&generators,
                     "\"CMAKE_HOME_DIRECTORY\" is set but incompatible with configured source directory value."
                     ,&local_221);
          setErrorMessage(errorMessage,(string *)&generators);
          std::__cxx11::string::~string((string *)&generators);
        }
        std::__cxx11::string::~string((string *)&valueCML);
        std::__cxx11::string::~string((string *)&cachedValueCML);
        std::__cxx11::string::~string((string *)&suffix);
        std::__cxx11::string::~string((string *)&cachedValue);
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&cachedValue,"CMAKE_GENERATOR_TOOLSET",(allocator *)&cachedValueCML);
          std::__cxx11::string::string((string *)&suffix,"toolset",(allocator *)&valueCML);
          bVar1 = testValue(state,&cachedValue,&toolset,&suffix,errorMessage);
          std::__cxx11::string::~string((string *)&suffix);
          std::__cxx11::string::~string((string *)&cachedValue);
          if (bVar1) {
            std::__cxx11::string::string
                      ((string *)&cachedValue,"CMAKE_GENERATOR_PLATFORM",
                       (allocator *)&cachedValueCML);
            std::__cxx11::string::string((string *)&suffix,"platform",(allocator *)&valueCML);
            bVar1 = testValue(state,&cachedValue,&platform,&suffix,errorMessage);
            std::__cxx11::string::~string((string *)&suffix);
            std::__cxx11::string::~string((string *)&cachedValue);
            if (bVar1) goto LAB_0042de9c;
          }
        }
      }
    }
    psVar7 = &cachePath;
  }
  else {
LAB_0042dea9:
    if (sourceDirectory._M_string_length == 0) {
      std::__cxx11::string::string((string *)&cachedValueCML,"\"",(allocator *)&valueCML);
      std::operator+(&suffix,&cachedValueCML,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&cachedValue,&suffix,"\" is unset but required.");
      setErrorMessage(errorMessage,&cachedValue);
    }
    else {
      bVar1 = cmsys::SystemTools::FileIsDirectory(&sourceDirectory);
      if (bVar1) {
        if (generator._M_string_length != 0) {
          generators.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          generators.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          generators.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmake::GetRegisteredGenerators(this_00,&generators);
          local_220 = generators.
                      super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          lVar9 = (long)generators.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)generators.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          __lhs = generators.
                  super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          for (lVar8 = lVar9 / 0x68 >> 2; pGVar5 = __lhs, 0 < lVar8; lVar8 = lVar8 + -1) {
            _Var2 = std::operator==(&__lhs->name,&generator);
            if (_Var2) goto LAB_0042e1b1;
            _Var2 = std::operator==(&__lhs[1].name,&generator);
            pGVar5 = __lhs + 1;
            if (_Var2) goto LAB_0042e1b1;
            _Var2 = std::operator==(&__lhs[2].name,&generator);
            pGVar5 = __lhs + 2;
            if (_Var2) goto LAB_0042e1b1;
            _Var2 = std::operator==(&__lhs[3].name,&generator);
            pGVar5 = __lhs + 3;
            if (_Var2) goto LAB_0042e1b1;
            __lhs = __lhs + 4;
            lVar9 = lVar9 + -0x1a0;
          }
          lVar9 = lVar9 / 0x68;
          if (lVar9 == 1) {
LAB_0042e196:
            _Var2 = std::operator==(&__lhs->name,&generator);
            pGVar5 = local_220;
            if (_Var2) {
              pGVar5 = __lhs;
            }
          }
          else if (lVar9 == 2) {
LAB_0042e172:
            _Var2 = std::operator==(&pGVar5->name,&generator);
            if (!_Var2) {
              __lhs = pGVar5 + 1;
              goto LAB_0042e196;
            }
          }
          else {
            pGVar5 = local_220;
            if ((lVar9 == 3) &&
               (_Var2 = std::operator==(&__lhs->name,&generator), pGVar5 = __lhs, !_Var2)) {
              pGVar5 = __lhs + 1;
              goto LAB_0042e172;
            }
          }
LAB_0042e1b1:
          if (pGVar5 == generators.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string
                      ((string *)&cachedValueCML,"Generator \"",(allocator *)&valueCML);
            std::operator+(&suffix,&cachedValueCML,&generator);
            std::operator+(&cachedValue,&suffix,"\" not supported.");
            setErrorMessage(errorMessage,&cachedValue);
            std::__cxx11::string::~string((string *)&cachedValue);
            std::__cxx11::string::~string((string *)&suffix);
            psVar7 = &cachedValueCML;
LAB_0042e482:
            std::__cxx11::string::~string((string *)psVar7);
            bVar1 = false;
          }
          else {
            cachedValue._M_string_length = (size_type)&extraGenerator;
            local_220 = generators.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            lVar9 = (long)generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            __it._M_current =
                 generators.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            cachedValue._M_dataplus._M_p = (pointer)&generator;
            for (lVar8 = lVar9 / 0x68 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it);
              _Var6._M_current = __it._M_current;
              if (bVar1) goto LAB_0042e358;
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it._M_current + 1);
              _Var6._M_current = __it._M_current + 1;
              if (bVar1) goto LAB_0042e358;
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it._M_current + 2);
              _Var6._M_current = __it._M_current + 2;
              if (bVar1) goto LAB_0042e358;
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it._M_current + 3);
              _Var6._M_current = __it._M_current + 3;
              if (bVar1) goto LAB_0042e358;
              __it._M_current = __it._M_current + 4;
              lVar9 = lVar9 + -0x1a0;
            }
            lVar9 = lVar9 / 0x68;
            if (lVar9 == 1) {
LAB_0042e519:
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it);
              _Var6._M_current = local_220;
              if (bVar1) {
                _Var6._M_current = __it._M_current;
              }
            }
            else if (lVar9 == 2) {
LAB_0042e333:
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                    *)&cachedValue,__it);
              _Var6._M_current = __it._M_current;
              if (!bVar1) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0042e519;
              }
            }
            else {
              _Var6._M_current = local_220;
              if ((lVar9 == 3) &&
                 (bVar1 = __gnu_cxx::__ops::
                          _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                          ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                        *)&cachedValue,__it), _Var6._M_current = __it._M_current,
                 !bVar1)) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0042e333;
              }
            }
LAB_0042e358:
            if (_Var6._M_current ==
                generators.
                super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::operator+(&valueCML,"The combination of generator \"",&generator);
              std::operator+(&cachedValueCML,&valueCML,"\" and extra generator \"");
              std::operator+(&suffix,&cachedValueCML,&extraGenerator);
              std::operator+(&cachedValue,&suffix,"\" is not supported.");
              setErrorMessage(errorMessage,&cachedValue);
              std::__cxx11::string::~string((string *)&cachedValue);
              std::__cxx11::string::~string((string *)&suffix);
              std::__cxx11::string::~string((string *)&cachedValueCML);
              psVar7 = &valueCML;
              goto LAB_0042e482;
            }
            if (((_Var6._M_current)->supportsToolset == false) && (toolset._M_string_length != 0)) {
              std::__cxx11::string::string
                        ((string *)&cachedValue,
                         "Toolset was provided but is not supported by the requested generator.",
                         (allocator *)&suffix);
              setErrorMessage(errorMessage,&cachedValue);
LAB_0042e47a:
              psVar7 = &cachedValue;
              goto LAB_0042e482;
            }
            if (((_Var6._M_current)->supportsPlatform == false) && (platform._M_string_length != 0))
            {
              std::__cxx11::string::string
                        ((string *)&cachedValue,
                         "Platform was provided but is not supported by the requested generator.",
                         (allocator *)&suffix);
              setErrorMessage(errorMessage,&cachedValue);
              goto LAB_0042e47a;
            }
            GeneratorInformation::GeneratorInformation
                      ((GeneratorInformation *)&cachedValue,&generator,&extraGenerator,&toolset,
                       &platform,&sourceDirectory,&buildDirectory);
            GeneratorInformation::operator=
                      (&this->GeneratorInfo,(GeneratorInformation *)&cachedValue);
            GeneratorInformation::~GeneratorInformation((GeneratorInformation *)&cachedValue);
            this->m_State = STATE_ACTIVE;
            bVar1 = true;
          }
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                    (&generators);
          goto LAB_0042e0db;
        }
        std::__cxx11::string::string((string *)&cachedValueCML,"\"",(allocator *)&valueCML);
        std::operator+(&suffix,&cachedValueCML,&kGENERATOR_KEY_abi_cxx11_);
        std::operator+(&cachedValue,&suffix,"\" is unset but required.");
        setErrorMessage(errorMessage,&cachedValue);
      }
      else {
        std::__cxx11::string::string((string *)&cachedValueCML,"\"",(allocator *)&valueCML);
        std::operator+(&suffix,&cachedValueCML,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
        std::operator+(&cachedValue,&suffix,"\" is not a directory.");
        setErrorMessage(errorMessage,&cachedValue);
      }
    }
LAB_0042e0b8:
    std::__cxx11::string::~string((string *)&cachedValue);
    std::__cxx11::string::~string((string *)&suffix);
    psVar7 = &cachedValueCML;
  }
  std::__cxx11::string::~string((string *)psVar7);
  bVar1 = false;
LAB_0042e0db:
  std::__cxx11::string::~string((string *)&platform);
  std::__cxx11::string::~string((string *)&toolset);
  std::__cxx11::string::~string((string *)&extraGenerator);
  std::__cxx11::string::~string((string *)&generator);
  std::__cxx11::string::~string((string *)&buildDirectory);
  std::__cxx11::string::~string((string *)&sourceDirectory);
  return bVar1;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  const std::string buildDirectory =
    request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cm->FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!testValue(state, "CMAKE_GENERATOR", generator, "generator",
                     errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!testValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                     "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!testHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!testValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                     errorMessage)) {
        return false;
      }

      // check platform:
      if (!testValue(state, "CMAKE_GENERATOR_PLATFORM", platform, "platform",
                     errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage, std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}